

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O3

void __thiscall WebServer::cachePage(WebServer *this,string *filename)

{
  int iVar1;
  long *plVar2;
  void *__addr;
  mapped_type *this_00;
  size_type *psVar3;
  undefined1 local_100 [8];
  stat fileStat;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  path.field_2._8_8_ = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(path.field_2._M_local_buf + 8),HttpConn::root_abi_cxx11_._M_dataplus._M_p,
             HttpConn::root_abi_cxx11_._M_dataplus._M_p + HttpConn::root_abi_cxx11_._M_string_length
            );
  std::__cxx11::string::append(path.field_2._M_local_buf + 8);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             (path.field_2._M_local_buf + 8,(ulong)(filename->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    path._M_string_length = *psVar3;
    path.field_2._M_allocated_capacity = plVar2[3];
    fileStat.__glibc_reserved[2] = (__syscall_slong_t)&path._M_string_length;
  }
  else {
    path._M_string_length = *psVar3;
    fileStat.__glibc_reserved[2] = (__syscall_slong_t)*plVar2;
  }
  path._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((size_type *)path.field_2._8_8_ != &__str._M_string_length) {
    operator_delete((void *)path.field_2._8_8_);
  }
  iVar1 = stat((char *)fileStat.__glibc_reserved[2],(stat *)local_100);
  if ((-1 < iVar1) &&
     (((uint)fileStat.st_nlink & 0xf000) != 0x4000 && ((uint)fileStat.st_nlink & 4) != 0)) {
    iVar1 = open((char *)fileStat.__glibc_reserved[2],0);
    __addr = mmap((void *)0x0,fileStat.st_rdev,1,2,iVar1,0);
    close(iVar1);
    if (__addr == (void *)0xffffffffffffffff) {
      __addr = (void *)0xffffffffffffffff;
    }
    else {
      path.field_2._8_8_ = &__str._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&path.field_2 + 8),__addr,(long)__addr + fileStat.st_rdev);
      this_00 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&HttpConn::cache__abi_cxx11_,filename);
      std::__cxx11::string::operator=((string *)this_00,(string *)(path.field_2._M_local_buf + 8));
      if ((size_type *)path.field_2._8_8_ != &__str._M_string_length) {
        operator_delete((void *)path.field_2._8_8_);
      }
    }
    munmap(__addr,fileStat.st_rdev);
  }
  if ((size_type *)fileStat.__glibc_reserved[2] != &path._M_string_length) {
    operator_delete((void *)fileStat.__glibc_reserved[2]);
  }
  return;
}

Assistant:

void WebServer::cachePage(const std::string& filename) {
    struct stat fileStat;
    std::string path = HttpConn::root + "/.." + filename; 
    if (stat(path.c_str(), &fileStat) < 0) {
        return;
    }
    if (!(fileStat.st_mode & S_IROTH)) {
        return;
    }
    if (S_ISDIR(fileStat.st_mode)) {
        return;
    }
    int fd = open(path.c_str(), O_RDONLY);
    void* mmapAddr = mmap(0, fileStat.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
    ::close(fd);
    if (mmapAddr == (void*)-1) {
        munmap(mmapAddr, fileStat.st_size);
        return;
    }

    char* file = static_cast<char*>(mmapAddr); 
    HttpConn::cache_[filename] = std::string(file, file + fileStat.st_size);
    munmap(mmapAddr, fileStat.st_size);
}